

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O2

void __thiscall
coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
ExecutorWrapper(ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                *this,basic_executor_type<std::allocator<void>,_0UL> *executor)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"default",&local_39);
  async_simple::Executor::Executor(&this->super_Executor,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Executor)._vptr_Executor = (_func_int **)&PTR__ExecutorWrapper_001b0660;
  (this->executor_).target_ = executor->target_;
  return;
}

Assistant:

ExecutorWrapper(ExecutorImpl executor) : executor_(executor) {}